

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void RGBColorTableRow_C(uint8_t *dst_argb,uint8_t *table_argb,int width)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      bVar1 = dst_argb[lVar3 * 4 + 1];
      bVar2 = dst_argb[lVar3 * 4 + 2];
      dst_argb[lVar3 * 4] = table_argb[(ulong)dst_argb[lVar3 * 4] * 4];
      dst_argb[lVar3 * 4 + 1] = table_argb[(ulong)bVar1 * 4 + 1];
      dst_argb[lVar3 * 4 + 2] = table_argb[(ulong)bVar2 * 4 + 2];
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void RGBColorTableRow_C(uint8_t* dst_argb,
                        const uint8_t* table_argb,
                        int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    dst_argb[0] = table_argb[b * 4 + 0];
    dst_argb[1] = table_argb[g * 4 + 1];
    dst_argb[2] = table_argb[r * 4 + 2];
    dst_argb += 4;
  }
}